

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.cc
# Opt level: O2

stringpiece_ssize_type __thiscall
google::protobuf::StringPiece::find_first_not_of(StringPiece *this,StringPiece s,size_type pos)

{
  long lVar1;
  stringpiece_ssize_type sVar2;
  size_type sVar3;
  bool *table;
  char *pcVar4;
  stringpiece_ssize_type i;
  StringPiece characters_wanted;
  bool lookup [256];
  
  pcVar4 = (char *)s.length_;
  lVar1 = this->length_;
  if (lVar1 < 1) {
    sVar3 = 0xffffffffffffffff;
  }
  else if ((long)pcVar4 < 1) {
    sVar3 = 0;
  }
  else {
    if (pcVar4 == (char *)0x1) {
      sVar2 = find_first_not_of(this,(char)*(protobuf *)s.ptr_,pos);
      return sVar2;
    }
    table = (bool *)pos;
    memset(lookup,0,0x100);
    characters_wanted.length_ = (stringpiece_ssize_type)lookup;
    characters_wanted.ptr_ = pcVar4;
    BuildLookupTable((protobuf *)s.ptr_,characters_wanted,table);
    while ((sVar3 = 0xffffffffffffffff, (long)pos < lVar1 &&
           (sVar3 = pos, lookup[(byte)this->ptr_[pos]] == true))) {
      pos = pos + 1;
    }
  }
  return sVar3;
}

Assistant:

stringpiece_ssize_type StringPiece::find_first_not_of(StringPiece s,
                                                      size_type pos) const {
  if (length_ <= 0) return npos;
  if (s.length_ <= 0) return 0;
  // Avoid the cost of BuildLookupTable() for a single-character search.
  if (s.length_ == 1) return find_first_not_of(s.ptr_[0], pos);

  bool lookup[UCHAR_MAX + 1] = { false };
  BuildLookupTable(s, lookup);
  for (stringpiece_ssize_type i = pos; i < length_; ++i) {
    if (!lookup[static_cast<unsigned char>(ptr_[i])]) {
      return i;
    }
  }
  return npos;
}